

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet
          (TessellationShaderInvarianceRule7Test *this,float *base_triangle_data,float *vertex_data,
          uint vertex_data_n_vertices)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == (ulong)vertex_data_n_vertices / 3) break;
    bVar2 = TessellationShaderUtils::isTriangleDefined
                      (vertex_data + (uint)((int)uVar3 * 9),base_triangle_data);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar3 < (ulong)vertex_data_n_vertices / 3;
}

Assistant:

bool TessellationShaderInvarianceRule7Test::isTriangleDefinedInVertexDataSet(const float* base_triangle_data,
																			 const float* vertex_data,
																			 unsigned int vertex_data_n_vertices)
{
	bool result = false;

	for (unsigned int n_triangle = 0; n_triangle < vertex_data_n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* current_triangle_data = vertex_data +
											 n_triangle * 3 * /* vertices per triangle */
												 3;			  /* components */

		if (TessellationShaderUtils::isTriangleDefined(current_triangle_data, base_triangle_data))
		{
			result = true;

			break;
		}
	} /* for (all vertices) */

	return result;
}